

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

int64_t jsonnet::internal::safeDoubleToInt64(double value,LocationRange *loc)

{
  uint uVar1;
  LocationRange *location;
  undefined8 uVar2;
  StaticError *in_RDI;
  double in_XMM0_Qa;
  int64_t DOUBLE_MIN_SAFE_INTEGER;
  int64_t DOUBLE_MAX_SAFE_INTEGER;
  string *in_stack_ffffffffffffff60;
  string *msg;
  LocationRange *in_stack_ffffffffffffff68;
  StaticError *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 uVar3;
  _Alloc_hider in_stack_ffffffffffffff87;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  
  uVar1 = std::isnan(in_XMM0_Qa);
  if ((uVar1 & 1) == 0) {
    uVar1 = std::isinf(in_XMM0_Qa);
    if ((uVar1 & 1) == 0) {
      if ((-9007199254740992.0 <= in_XMM0_Qa) && (in_XMM0_Qa <= 9007199254740992.0)) {
        return (long)in_XMM0_Qa;
      }
      uVar3 = 1;
      uVar2 = __cxa_allocate_exception(0x60);
      msg = (string *)&stack0xffffffffffffff87;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (allocator<char> *)
                 CONCAT17(in_stack_ffffffffffffff87,CONCAT16(uVar3,in_stack_ffffffffffffff80)));
      StaticError::StaticError(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,msg);
      __cxa_throw(uVar2,&StaticError::typeinfo,StaticError::~StaticError);
    }
  }
  location = (LocationRange *)__cxa_allocate_exception(0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffff87,
                      CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
  StaticError::StaticError(in_RDI,location,in_stack_ffffffffffffff60);
  __cxa_throw(location,&StaticError::typeinfo,StaticError::~StaticError);
}

Assistant:

inline int64_t safeDoubleToInt64(double value, const internal::LocationRange& loc) {
    if (std::isnan(value) || std::isinf(value)) {
        throw internal::StaticError(loc, "numeric value is not finite");
    }

    // Constants for safe double-to-int conversion
    // Jsonnet uses IEEE 754 doubles, which precisely represent integers in the range [-2^53, 2^53].
    constexpr int64_t DOUBLE_MAX_SAFE_INTEGER = 1LL << 53;
    constexpr int64_t DOUBLE_MIN_SAFE_INTEGER = -(1LL << 53);

    // Check if the value is within the safe integer range
    if (value < DOUBLE_MIN_SAFE_INTEGER || value > DOUBLE_MAX_SAFE_INTEGER) {
        throw internal::StaticError(loc, "numeric value outside safe integer range for bitwise operation.");
    }
    return static_cast<int64_t>(value);
}